

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O2

uint64_t lzma_outq_memusage(uint64_t buf_size_max,uint32_t threads)

{
  if (buf_size_max >> 0x30 != 0 || 0x4000 < threads) {
    return 0xffffffffffffffff;
  }
  return (threads * 2) * buf_size_max + (ulong)(threads * 0x50) + 0x30;
}

Assistant:

static lzma_ret
get_options(uint64_t *bufs_alloc_size, uint32_t *bufs_count,
		uint64_t buf_size_max, uint32_t threads)
{
	if (threads > LZMA_THREADS_MAX || buf_size_max > BUF_SIZE_MAX)
		return LZMA_OPTIONS_ERROR;

	// The number of buffers is twice the number of threads.
	// This wastes RAM but keeps the threads busy when buffers
	// finish out of order.
	//
	// NOTE: If this is changed, update BUF_SIZE_MAX too.
	*bufs_count = threads * 2;
	*bufs_alloc_size = *bufs_count * buf_size_max;

	return LZMA_OK;
}